

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int spacePush(xmlParserCtxtPtr ctxt,int val)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar3 = ctxt->spaceNr;
  uVar1 = ctxt->spaceMax;
  if (iVar3 < (int)uVar1) {
    piVar4 = ctxt->spaceTab;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar6 = 10;
    }
    else {
      if (999999999 < uVar1) goto LAB_0013f6bf;
      uVar5 = uVar1 + 1 >> 1;
      uVar2 = uVar5 + uVar1;
      if (1000000000 - uVar5 < uVar1) {
        uVar2 = 1000000000;
      }
      uVar6 = (ulong)uVar2;
    }
    piVar4 = (int *)(*xmlRealloc)(ctxt->spaceTab,uVar6 << 2);
    if (piVar4 == (int *)0x0) {
LAB_0013f6bf:
      xmlCtxtErrMemory(ctxt);
      return extraout_EAX;
    }
    ctxt->spaceTab = piVar4;
    ctxt->spaceMax = (int)uVar6;
    iVar3 = ctxt->spaceNr;
  }
  piVar4[iVar3] = val;
  ctxt->space = piVar4 + ctxt->spaceNr;
  iVar3 = ctxt->spaceNr + 1;
  ctxt->spaceNr = iVar3;
  return iVar3;
}

Assistant:

static int spacePush(xmlParserCtxtPtr ctxt, int val) {
    if (ctxt->spaceNr >= ctxt->spaceMax) {
        int *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->spaceMax, sizeof(tmp[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlErrMemory(ctxt);
	    return(-1);
        }

        tmp = xmlRealloc(ctxt->spaceTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
	    xmlErrMemory(ctxt);
	    return(-1);
	}
	ctxt->spaceTab = tmp;

        ctxt->spaceMax = newSize;
    }
    ctxt->spaceTab[ctxt->spaceNr] = val;
    ctxt->space = &ctxt->spaceTab[ctxt->spaceNr];
    return(ctxt->spaceNr++);
}